

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Estimators.cc
# Opt level: O1

void __thiscall Estimate::UKF::SigmaPts2Estimate(UKF *this)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  uint uVar7;
  double dVar8;
  UKF *pUVar9;
  long lVar10;
  undefined8 *puVar11;
  uint uVar12;
  Index index;
  ulong uVar13;
  Index row;
  long lVar14;
  Index inner;
  double *pdVar15;
  Index othersize;
  double *pdVar16;
  ulong uVar17;
  VectorXd xhat;
  MatrixXd Xi;
  VectorXd w;
  MatrixXd Phat;
  MatrixXd d;
  add_assign_op<double,_double> local_e9;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_e8;
  DenseStorage<double,__1,__1,__1,_0> local_d8;
  DenseStorage<double,__1,__1,_1,_0> local_c0;
  Matrix<double,__1,__1,_0,__1,__1> local_b0;
  UKF *local_98;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_90;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_58;
  void *local_48;
  double *local_40;
  long lStack_38;
  
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_d8,(DenseStorage<double,__1,__1,__1,_0> *)&this->Xi_);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            (&local_c0,(DenseStorage<double,__1,__1,_1,_0> *)&this->w_);
  iVar6 = this->n_;
  pdVar16 = (double *)(long)iVar6;
  local_e8.m_storage.m_data = (double *)0x0;
  local_e8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_e8,(Index)pdVar16,1);
  if ((double *)local_e8.m_storage.m_rows != pdVar16) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&local_e8,(Index)pdVar16,1);
  }
  if (0 < local_e8.m_storage.m_rows) {
    memset(local_e8.m_storage.m_data,0,local_e8.m_storage.m_rows << 3);
  }
  local_90.m_lhs.m_lhs.m_cols.m_value = 0;
  local_98 = this;
  local_90.m_lhs._0_8_ = pdVar16;
  local_90.m_lhs.m_lhs.m_rows.m_value = (long)pdVar16;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_b0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_90);
  uVar7 = iVar6 * 2;
  if (-1 < iVar6) {
    lVar10 = 0;
    uVar12 = 0;
    if (0 < (int)uVar7) {
      uVar12 = uVar7;
    }
    uVar13 = 0;
    do {
      dVar4 = local_c0.m_data[uVar13];
      pdVar15 = (double *)(local_e8.m_storage.m_rows & 0xfffffffffffffffe);
      if (0 < (long)pdVar15) {
        lVar14 = 0;
        do {
          pdVar1 = (double *)((long)local_d8.m_data + lVar14 * 8 + local_d8.m_rows * lVar10);
          dVar8 = pdVar1[1];
          dVar5 = (local_e8.m_storage.m_data + lVar14)[1];
          local_e8.m_storage.m_data[lVar14] = *pdVar1 * dVar4 + local_e8.m_storage.m_data[lVar14];
          (local_e8.m_storage.m_data + lVar14)[1] = dVar8 * dVar4 + dVar5;
          lVar14 = lVar14 + 2;
        } while (lVar14 < (long)pdVar15);
      }
      if (pdVar15 != (double *)local_e8.m_storage.m_rows) {
        do {
          local_e8.m_storage.m_data[(long)pdVar15] =
               *(double *)((long)local_d8.m_data + (long)pdVar15 * 8 + local_d8.m_rows * lVar10) *
               dVar4 + local_e8.m_storage.m_data[(long)pdVar15];
          pdVar15 = (double *)((long)pdVar15 + 1);
        } while ((long)pdVar15 < local_e8.m_storage.m_rows);
      }
      uVar13 = uVar13 + 1;
      lVar10 = lVar10 + 8;
    } while (uVar13 != (uVar12 | 1));
  }
  if (-1 < iVar6) {
    uVar17 = 0;
    uVar13 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar13 = uVar17;
    }
    do {
      local_90.m_lhs._0_8_ = local_d8.m_data + local_d8.m_rows * uVar17;
      local_90.m_lhs.m_lhs.m_cols.m_value = 1;
      local_90.m_lhs.m_lhs.m_functor.m_other = (double)&local_d8;
      local_90.m_lhs.m_rhs = (RhsNested)0x0;
      local_90.m_rhs.m_matrix = (non_const_type)local_d8.m_rows;
      local_58 = &local_e8;
      local_90.m_lhs.m_lhs.m_rows.m_value = (long)pdVar16;
      local_90.m_lhs._40_8_ = uVar17;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_48,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_90);
      local_90.m_lhs.m_lhs.m_functor.m_other = local_c0.m_data[uVar17];
      local_90.m_lhs.m_lhs.m_rows.m_value = (long)local_40;
      local_90.m_lhs.m_lhs.m_cols.m_value = lStack_38;
      local_90.m_lhs.m_rhs = (RhsNested)&local_48;
      local_90.m_rhs.m_matrix = (non_const_type)&local_48;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>,Eigen::internal::add_assign_op<double,double>>
                (&local_b0,&local_90,&local_e9,(type)0x0);
      free(local_48);
      uVar17 = uVar17 + 1;
    } while (uVar13 + 1 != uVar17);
  }
  pUVar9 = local_98;
  pdVar16 = local_b0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data;
  if (((local_98->Phat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_rows != local_b0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                 .m_rows) ||
     ((local_98->Phat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols != local_b0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_cols)) {
    if ((local_b0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
         != 0 && local_b0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                 .m_rows != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) /
               SEXT816(local_b0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_cols),0) <
        local_b0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows))
    {
      puVar11 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar11 = std::ios::widen;
      __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&local_98->Phat_,
               local_b0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_cols * local_b0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_rows,
               local_b0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows,local_b0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols);
  }
  pdVar1 = local_e8.m_storage.m_data;
  pdVar15 = (pUVar9->Phat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_data;
  lVar10 = (pUVar9->Phat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_cols *
           (pUVar9->Phat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows;
  uVar13 = lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < lVar10) {
    lVar14 = 0;
    do {
      pdVar2 = pdVar16 + lVar14;
      dVar4 = pdVar2[1];
      pdVar3 = pdVar15 + lVar14;
      *pdVar3 = *pdVar2;
      pdVar3[1] = dVar4;
      lVar14 = lVar14 + 2;
    } while (lVar14 < (long)uVar13);
  }
  if ((long)uVar13 < lVar10) {
    do {
      pdVar15[uVar13] = pdVar16[uVar13];
      uVar13 = uVar13 + 1;
    } while (lVar10 - uVar13 != 0);
  }
  if ((double *)
      (pUVar9->xhat_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows != (double *)local_e8.m_storage.m_rows) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(pUVar9->xhat_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               local_e8.m_storage.m_rows,1);
  }
  pdVar16 = (pUVar9->xhat_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_data;
  uVar13 = (pUVar9->xhat_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  uVar17 = uVar13 - ((long)uVar13 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar13) {
    lVar10 = 0;
    do {
      pdVar15 = pdVar1 + lVar10;
      dVar4 = pdVar15[1];
      pdVar2 = pdVar16 + lVar10;
      *pdVar2 = *pdVar15;
      pdVar2[1] = dVar4;
      lVar10 = lVar10 + 2;
    } while (lVar10 < (long)uVar17);
  }
  if ((long)uVar17 < (long)uVar13) {
    do {
      pdVar16[uVar17] = pdVar1[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar13 != uVar17);
  }
  free(local_b0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_e8.m_storage.m_data);
  free(local_c0.m_data);
  free(local_d8.m_data);
  return;
}

Assistant:

void UKF::SigmaPts2Estimate(){

		//extract locals
		Eigen::MatrixXd Xi = this->Xi_;
		Eigen::VectorXd w = this->w_;
		int n = this->n_;

		//initialize variables
		Eigen::VectorXd xhat = Eigen::VectorXd::Zero(n);
		Eigen::MatrixXd Phat = Eigen::MatrixXd::Zero(n,n);

		//get estimate
		for (int i = 0; i < (2*n + 1); ++i) {
			xhat += w(i)*Xi.block(0,i,n,1);
		}

		//get covariance
		for (int i = 0; i < (2*n + 1); ++i) {
			Eigen::MatrixXd d = Xi.block(0,i,n,1) - xhat;
			Phat += w(i)*d*d.transpose();
		}

		//assign
		this->Phat_ = Phat;
		this->xhat_ = xhat;


	}